

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportProperty.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::FBXExportProperty::FBXExportProperty(FBXExportProperty *this,aiMatrix4x4 *vm)

{
  uchar *puVar1;
  float *pfVar2;
  uint local_40;
  uint local_3c;
  uint r;
  uint c;
  double *d;
  allocator<unsigned_char> local_19;
  aiMatrix4x4 *local_18;
  aiMatrix4x4 *vm_local;
  FBXExportProperty *this_local;
  
  this->type = 'd';
  local_18 = vm;
  vm_local = (aiMatrix4x4 *)this;
  std::allocator<unsigned_char>::allocator(&local_19);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->data,0x80,&local_19);
  std::allocator<unsigned_char>::~allocator(&local_19);
  puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->data);
  for (local_3c = 0; local_3c < 4; local_3c = local_3c + 1) {
    for (local_40 = 0; local_40 < 4; local_40 = local_40 + 1) {
      pfVar2 = aiMatrix4x4t<float>::operator[](local_18,local_40);
      *(double *)(puVar1 + (ulong)(local_3c * 4 + local_40) * 8) = (double)pfVar2[local_3c];
    }
  }
  return;
}

Assistant:

FBXExportProperty::FBXExportProperty(const aiMatrix4x4& vm)
: type('d')
, data(8 * 16) {
    double* d = reinterpret_cast<double*>(data.data());
    for (unsigned int c = 0; c < 4; ++c) {
        for (unsigned int r = 0; r < 4; ++r) {
            d[4 * c + r] = vm[r][c];
        }
    }
}